

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

string * __thiscall
leveldb::VersionEdit::DebugString_abi_cxx11_(string *__return_storage_ptr__,VersionEdit *this)

{
  FileMetaData *pFVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  FileMetaData *pFVar6;
  const_reference pvVar7;
  string local_b8;
  string local_98;
  FileMetaData *local_78;
  FileMetaData *f;
  size_t i_1;
  pair<int,_unsigned_long> *deleted_files_kvp;
  iterator __end1;
  iterator __begin1;
  DeletedFileSet *__range1;
  ulong local_28;
  size_t i;
  VersionEdit *local_18;
  VersionEdit *this_local;
  string *r;
  
  i._7_1_ = 0;
  local_18 = this;
  this_local = (VersionEdit *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->has_comparator_ & 1U) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  if ((this->has_log_number_ & 1U) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->log_number_);
  }
  if ((this->has_prev_log_number_ & 1U) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->prev_log_number_);
  }
  if ((this->has_next_file_number_ & 1U) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->next_file_number_);
  }
  if ((this->has_last_sequence_ & 1U) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,this->last_sequence_);
  }
  for (local_28 = 0; uVar2 = local_28,
      sVar4 = std::
              vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
              ::size(&this->compact_pointers_), uVar2 < sVar4; local_28 = local_28 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar5 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[](&this->compact_pointers_,local_28);
    AppendNumberTo(__return_storage_ptr__,(long)pvVar5->first);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar5 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[](&this->compact_pointers_,local_28);
    InternalKey::DebugString_abi_cxx11_((string *)&__range1,&pvVar5->second);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&__range1);
  }
  __end1 = std::
           set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           ::begin(&this->deleted_files_);
  deleted_files_kvp =
       (pair<int,_unsigned_long> *)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end(&this->deleted_files_);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&deleted_files_kvp), bVar3) {
    i_1 = (size_t)std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*(&__end1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,(long)*(int *)i_1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,*(uint64_t *)(i_1 + 8));
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++(&__end1);
  }
  for (f = (FileMetaData *)0x0; pFVar1 = f,
      pFVar6 = (FileMetaData *)
               std::
               vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ::size(&this->new_files_), pFVar1 < pFVar6; f = (FileMetaData *)((long)&f->refs + 1))
  {
    pvVar7 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[](&this->new_files_,(size_type)f);
    local_78 = &pvVar7->second;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar7 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[](&this->new_files_,(size_type)f);
    AppendNumberTo(__return_storage_ptr__,(long)pvVar7->first);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,local_78->number);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,local_78->file_size);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    InternalKey::DebugString_abi_cxx11_(&local_98,&local_78->smallest);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    InternalKey::DebugString_abi_cxx11_(&local_b8,&local_78->largest);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VersionEdit::DebugString() const {
  std::string r;
  r.append("VersionEdit {");
  if (has_comparator_) {
    r.append("\n  Comparator: ");
    r.append(comparator_);
  }
  if (has_log_number_) {
    r.append("\n  LogNumber: ");
    AppendNumberTo(&r, log_number_);
  }
  if (has_prev_log_number_) {
    r.append("\n  PrevLogNumber: ");
    AppendNumberTo(&r, prev_log_number_);
  }
  if (has_next_file_number_) {
    r.append("\n  NextFile: ");
    AppendNumberTo(&r, next_file_number_);
  }
  if (has_last_sequence_) {
    r.append("\n  LastSeq: ");
    AppendNumberTo(&r, last_sequence_);
  }
  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    r.append("\n  CompactPointer: ");
    AppendNumberTo(&r, compact_pointers_[i].first);
    r.append(" ");
    r.append(compact_pointers_[i].second.DebugString());
  }
  for (const auto& deleted_files_kvp : deleted_files_) {
    r.append("\n  RemoveFile: ");
    AppendNumberTo(&r, deleted_files_kvp.first);
    r.append(" ");
    AppendNumberTo(&r, deleted_files_kvp.second);
  }
  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    r.append("\n  AddFile: ");
    AppendNumberTo(&r, new_files_[i].first);
    r.append(" ");
    AppendNumberTo(&r, f.number);
    r.append(" ");
    AppendNumberTo(&r, f.file_size);
    r.append(" ");
    r.append(f.smallest.DebugString());
    r.append(" .. ");
    r.append(f.largest.DebugString());
  }
  r.append("\n}\n");
  return r;
}